

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_ipfs.c
# Opt level: O0

char * ipfs_gateway(void)

{
  CURLcode CVar1;
  char *pcVar2;
  size_t sVar3;
  bool bVar4;
  undefined1 local_61;
  undefined1 local_60 [7];
  char c_char;
  dynbuf dyn;
  int c;
  char *home;
  char *gateway;
  FILE *gateway_file;
  char *gateway_composed_file_path;
  char *ipfs_path;
  
  gateway_composed_file_path = (char *)0x0;
  gateway_file = (FILE *)0x0;
  gateway = (char *)0x0;
  home = (char *)curl_getenv("IPFS_GATEWAY");
  if (home == (char *)0x0) {
    gateway_composed_file_path = (char *)curl_getenv("IPFS_PATH");
    if (((gateway_composed_file_path == (char *)0x0) &&
        (pcVar2 = getenv("HOME"), pcVar2 != (char *)0x0)) && (*pcVar2 != '\0')) {
      gateway_composed_file_path = (char *)curl_maprintf("%s/.ipfs/",pcVar2);
    }
    if ((gateway_composed_file_path != (char *)0x0) &&
       (CVar1 = ensure_trailing_slash(&gateway_composed_file_path), CVar1 == CURLE_OK)) {
      gateway_file = (FILE *)curl_maprintf("%sgateway",gateway_composed_file_path);
      if (gateway_file == (FILE *)0x0) {
        gateway_file = (FILE *)0x0;
      }
      else {
        gateway = (char *)fopen64((char *)gateway_file,"r");
        free(gateway_file);
        gateway_file = (FILE *)0x0;
        if (gateway != (char *)0x0) {
          curlx_dyn_init((dynbuf *)local_60,10000);
          do {
            dyn.toobig._4_4_ = getc((FILE *)gateway);
            bVar4 = false;
            if ((dyn.toobig._4_4_ != -1) && (bVar4 = false, dyn.toobig._4_4_ != 10)) {
              bVar4 = dyn.toobig._4_4_ != 0xd;
            }
            if (!bVar4) {
              fclose((FILE *)gateway);
              gateway = (char *)0x0;
              sVar3 = curlx_dyn_len((dynbuf *)local_60);
              if (sVar3 != 0) {
                home = curlx_dyn_ptr((dynbuf *)local_60);
              }
              if (home != (char *)0x0) {
                ensure_trailing_slash(&home);
              }
              if (home != (char *)0x0) {
                free(gateway_composed_file_path);
                return home;
              }
              break;
            }
            local_61 = (undefined1)dyn.toobig._4_4_;
            CVar1 = curlx_dyn_addn((dynbuf *)local_60,&local_61,1);
          } while (CVar1 == CURLE_OK);
        }
      }
    }
  }
  else {
    CVar1 = ensure_trailing_slash(&home);
    if (CVar1 == CURLE_OK) {
      return home;
    }
  }
  if (gateway != (char *)0x0) {
    fclose((FILE *)gateway);
  }
  free(home);
  home = (char *)0x0;
  free(gateway_composed_file_path);
  return (char *)0x0;
}

Assistant:

static char *ipfs_gateway(void)
{
  char *ipfs_path = NULL;
  char *gateway_composed_file_path = NULL;
  FILE *gateway_file = NULL;
  char *gateway = curl_getenv("IPFS_GATEWAY");

  /* Gateway is found from environment variable. */
  if(gateway) {
    if(ensure_trailing_slash(&gateway))
      goto fail;
    return gateway;
  }

  /* Try to find the gateway in the IPFS data folder. */
  ipfs_path = curl_getenv("IPFS_PATH");

  if(!ipfs_path) {
    char *home = getenv("HOME");
    if(home && *home)
      ipfs_path = aprintf("%s/.ipfs/", home);
    /* fallback to "~/.ipfs", as that is the default location. */
  }

  if(!ipfs_path || ensure_trailing_slash(&ipfs_path))
    goto fail;

  gateway_composed_file_path = aprintf("%sgateway", ipfs_path);

  if(!gateway_composed_file_path)
    goto fail;

  gateway_file = fopen(gateway_composed_file_path, FOPEN_READTEXT);
  Curl_safefree(gateway_composed_file_path);

  if(gateway_file) {
    int c;
    struct curlx_dynbuf dyn;
    curlx_dyn_init(&dyn, MAX_GATEWAY_URL_LEN);

    /* get the first line of the gateway file, ignore the rest */
    while((c = getc(gateway_file)) != EOF && c != '\n' && c != '\r') {
      char c_char = (char)c;
      if(curlx_dyn_addn(&dyn, &c_char, 1))
        goto fail;
    }

    fclose(gateway_file);
    gateway_file = NULL;

    if(curlx_dyn_len(&dyn))
      gateway = curlx_dyn_ptr(&dyn);

    if(gateway)
      ensure_trailing_slash(&gateway);

    if(!gateway)
      goto fail;

    Curl_safefree(ipfs_path);

    return gateway;
  }
fail:
  if(gateway_file)
    fclose(gateway_file);
  Curl_safefree(gateway);
  Curl_safefree(ipfs_path);
  return NULL;
}